

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::grabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool implicit)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QGraphicsItem **ppQVar4;
  QGraphicsItem *this_00;
  long lVar5;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->mouseGrabberItems).d.size;
  if (lVar3 != 0) {
    ppQVar4 = (this->mouseGrabberItems).d.ptr;
    lVar5 = 0;
    do {
      if (lVar3 * 8 - lVar5 == 0) goto LAB_006015a8;
      lVar1 = lVar5 + 8;
      plVar2 = (long *)((long)ppQVar4 + lVar5);
      lVar5 = lVar1;
    } while ((QGraphicsItem *)*plVar2 != item);
    if (lVar1 != 0) {
      if (ppQVar4[lVar3 + -1] == item) {
        if ((*(uint *)&this->field_0xb8 >> 0xb & 1) == 0) {
          grabMouse();
        }
        else {
          *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffff7ff;
        }
      }
      else {
        local_58._0_4_ = 2;
        local_58._4_4_ = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        local_44 = 0;
        local_40 = "default";
        QMessageLogger::warning
                  ((char *)&local_58,
                   "QGraphicsItem::grabMouse: already blocked by mouse grabber: %p");
      }
      goto LAB_00601666;
    }
LAB_006015a8:
    this_00 = ppQVar4[lVar3 + -1];
    if ((this->field_0xb9 & 8) == 0) {
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,UngrabMouse);
      sendEvent(this,this_00,(QEvent *)&local_58);
      QEvent::~QEvent((QEvent *)&local_58);
    }
    else {
      QGraphicsItem::ungrabMouse(this_00);
    }
  }
  local_58 = item;
  QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
            ((QPodArrayOps<QGraphicsItem*> *)&this->mouseGrabberItems,
             (this->mouseGrabberItems).d.size,(QGraphicsItem **)&local_58);
  QList<QGraphicsItem_*>::end(&this->mouseGrabberItems);
  *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffff7ff | (uint)implicit << 0xb;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_58,GrabMouse);
  sendEvent(this,item,(QEvent *)&local_58);
  QEvent::~QEvent((QEvent *)&local_58);
LAB_00601666:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabMouse(QGraphicsItem *item, bool implicit)
{
    // Append to list of mouse grabber items, and send a mouse grab event.
    if (mouseGrabberItems.contains(item)) {
        if (mouseGrabberItems.constLast() == item) {
            Q_ASSERT(!implicit);
            if (!lastMouseGrabberItemHasImplicitMouseGrab) {
                qWarning("QGraphicsItem::grabMouse: already a mouse grabber");
            } else {
                // Upgrade to an explicit mouse grab
                lastMouseGrabberItemHasImplicitMouseGrab = false;
            }
        } else {
            qWarning("QGraphicsItem::grabMouse: already blocked by mouse grabber: %p",
                     mouseGrabberItems.constLast());
        }
        return;
    }

    // Send ungrab event to the last grabber.
    if (!mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        if (lastMouseGrabberItemHasImplicitMouseGrab) {
            // Implicit mouse grab is immediately lost.
            last->ungrabMouse();
        } else {
            // Just send ungrab event to current grabber.
            QEvent ungrabEvent(QEvent::UngrabMouse);
            sendEvent(last, &ungrabEvent);
        }
    }

    mouseGrabberItems << item;
    lastMouseGrabberItemHasImplicitMouseGrab = implicit;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabMouse);
    sendEvent(item, &grabEvent);
}